

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VtabCallCreate(sqlite3 *db,int iDb,char *zTab,char **pzErr)

{
  Table *pTab_00;
  Module *pMod_00;
  char *pcVar1;
  VTable *pVVar2;
  char *zMod;
  Module *pMod;
  Table *pTab;
  int rc;
  char **pzErr_local;
  char *zTab_local;
  int iDb_local;
  sqlite3 *db_local;
  
  pTab_00 = sqlite3FindTable(db,zTab,db->aDb[iDb].zDbSName);
  pcVar1 = *pTab_00->azModuleArg;
  pMod_00 = (Module *)sqlite3HashFind(&db->aModule,pcVar1);
  if (((pMod_00 == (Module *)0x0) ||
      (pMod_00->pModule->xCreate ==
       (_func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr *)0x0)) ||
     (pMod_00->pModule->xDestroy == (_func_int_sqlite3_vtab_ptr *)0x0)) {
    pcVar1 = sqlite3MPrintf(db,"no such module: %s",pcVar1);
    *pzErr = pcVar1;
    pTab._4_4_ = 1;
  }
  else {
    pTab._4_4_ = vtabCallConstructor(db,pTab_00,pMod_00,pMod_00->pModule->xCreate,pzErr);
  }
  if (((pTab._4_4_ == 0) && (pVVar2 = sqlite3GetVTable(db,pTab_00), pVVar2 != (VTable *)0x0)) &&
     (pTab._4_4_ = growVTrans(db), pTab._4_4_ == 0)) {
    pVVar2 = sqlite3GetVTable(db,pTab_00);
    addToVTrans(db,pVVar2);
  }
  return pTab._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VtabCallCreate(sqlite3 *db, int iDb, const char *zTab, char **pzErr){
  int rc = SQLITE_OK;
  Table *pTab;
  Module *pMod;
  const char *zMod;

  pTab = sqlite3FindTable(db, zTab, db->aDb[iDb].zDbSName);
  assert( pTab && IsVirtual(pTab) && !pTab->pVTable );

  /* Locate the required virtual table module */
  zMod = pTab->azModuleArg[0];
  pMod = (Module*)sqlite3HashFind(&db->aModule, zMod);

  /* If the module has been registered and includes a Create method, 
  ** invoke it now. If the module has not been registered, return an 
  ** error. Otherwise, do nothing.
  */
  if( pMod==0 || pMod->pModule->xCreate==0 || pMod->pModule->xDestroy==0 ){
    *pzErr = sqlite3MPrintf(db, "no such module: %s", zMod);
    rc = SQLITE_ERROR;
  }else{
    rc = vtabCallConstructor(db, pTab, pMod, pMod->pModule->xCreate, pzErr);
  }

  /* Justification of ALWAYS():  The xConstructor method is required to
  ** create a valid sqlite3_vtab if it returns SQLITE_OK. */
  if( rc==SQLITE_OK && ALWAYS(sqlite3GetVTable(db, pTab)) ){
    rc = growVTrans(db);
    if( rc==SQLITE_OK ){
      addToVTrans(db, sqlite3GetVTable(db, pTab));
    }
  }

  return rc;
}